

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O0

void rr::initEdgeCCW(EdgeFunction *edge,HorizontalFill horizontalFill,VerticalFill verticalFill,
                    deInt64 x0,deInt64 y0,deInt64 x1,deInt64 y1)

{
  bool local_43;
  bool local_42;
  bool local_41;
  bool inclusive;
  deInt64 yd;
  deInt64 xd;
  deInt64 x1_local;
  deInt64 y0_local;
  deInt64 x0_local;
  VerticalFill verticalFill_local;
  HorizontalFill horizontalFill_local;
  EdgeFunction *edge_local;
  
  if (y1 == y0) {
    if (verticalFill == FILL_BOTTOM) {
      local_42 = -1 < x1 - x0;
    }
    else {
      local_42 = x1 - x0 < 1;
    }
    local_41 = local_42;
  }
  else {
    if (horizontalFill == FILL_LEFT) {
      local_43 = y1 - y0 < 1;
    }
    else {
      local_43 = -1 < y1 - y0;
    }
    local_41 = local_43;
  }
  edge->a = y0 - y1;
  edge->b = x1 - x0;
  edge->c = x0 * y1 - y0 * x1;
  edge->inclusive = local_41;
  return;
}

Assistant:

static inline void initEdgeCCW (EdgeFunction& edge, const HorizontalFill horizontalFill, const VerticalFill verticalFill, const deInt64 x0, const deInt64 y0, const deInt64 x1, const deInt64 y1)
{
	// \note See EdgeFunction documentation for details.

	const deInt64	xd			= x1-x0;
	const deInt64	yd			= y1-y0;
	bool			inclusive	= false;	//!< Inclusive in CCW orientation.

	if (yd == 0)
		inclusive = verticalFill == FILL_BOTTOM ? xd >= 0 : xd <= 0;
	else
		inclusive = horizontalFill == FILL_LEFT ? yd <= 0 : yd >= 0;

	edge.a			= (y0 - y1);
	edge.b			= (x1 - x0);
	edge.c			= x0*y1 - y0*x1;
	edge.inclusive	= inclusive; //!< \todo [pyry] Swap for CW triangles
}